

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O0

TypeOneDRule TasGrid::IO::readRule<TasGrid::IO::mode_binary_type>(istream *is)

{
  int r;
  TypeOneDRule TVar1;
  istream *is_local;
  
  r = readNumber<TasGrid::IO::mode_binary_type,int>(is);
  TVar1 = getRuleInt(r);
  return TVar1;
}

Assistant:

TypeOneDRule readRule(std::istream &is){
    if (std::is_same<iomode, mode_ascii_type>::value){
        std::string T;
        is >> T;
        return getRuleString(T);
    }else{
        return getRuleInt(readNumber<mode_binary_type, int>(is));
    }
}